

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O1

void Vta_ManProfileAddition(Vta_Man_t *p,Vec_Int_t *vTermsToAdd)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  void *pvVar5;
  long lVar6;
  Vta_Obj_t *pVVar7;
  int iVar8;
  size_t __nmemb;
  
  __nmemb = (long)p->pPars->iFrame + 1;
  pvVar5 = calloc(__nmemb,4);
  iVar8 = vTermsToAdd->nSize;
  if (0 < (long)iVar8) {
    piVar4 = vTermsToAdd->pArray;
    lVar6 = 0;
    do {
      iVar2 = piVar4[lVar6];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
        __assert_fail("i >= 0 && i < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                      ,0x68,"Vta_Obj_t *Vta_ManObj(Vta_Man_t *, int)");
      }
      if (iVar2 == 0) {
        pVVar7 = (Vta_Obj_t *)0x0;
      }
      else {
        pVVar7 = p->pObjs + iVar2;
      }
      if (pVVar7 == (Vta_Obj_t *)0x0) break;
      uVar3 = pVVar7->iObj;
      __nmemb = (size_t)uVar3;
      if (((int)uVar3 < 0) || (p->pGia->nObjs <= (int)uVar3)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pGia->pObjs == (Gia_Obj_t *)0x0) break;
      piVar1 = (int *)((long)pvVar5 + (long)pVVar7->iFrame * 4);
      *piVar1 = *piVar1 + 1;
      lVar6 = lVar6 + 1;
    } while (iVar8 != lVar6);
  }
  iVar8 = (int)__nmemb;
  if (-1 < p->pPars->iFrame) {
    lVar6 = -1;
    do {
      Abc_Print((int)__nmemb,"%2d",(ulong)*(uint *)((long)pvVar5 + lVar6 * 4 + 4));
      iVar8 = (int)__nmemb;
      lVar6 = lVar6 + 1;
    } while (lVar6 < p->pPars->iFrame);
  }
  Abc_Print(iVar8,"***\n");
  return;
}

Assistant:

void Vta_ManProfileAddition( Vta_Man_t * p, Vec_Int_t * vTermsToAdd )
{
    Vta_Obj_t * pThis;
    Gia_Obj_t * pObj;
    // profile the added ones
    int i, * pCounters = ABC_CALLOC( int, p->pPars->iFrame+1 );
    Vta_ManForEachObjObjVec( vTermsToAdd, p, pThis, pObj, i )
        pCounters[pThis->iFrame]++;
    for ( i = 0; i <= p->pPars->iFrame; i++ )
        Abc_Print( 1, "%2d", pCounters[i] );
    Abc_Print( 1, "***\n" );
}